

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_descendant_schema_nodeid
              (char *nodeid,lys_node *start,int ret_nodetype,int check_shorthand,int no_innerlist,
              lys_node **ret)

{
  lys_module *module_00;
  int iVar1;
  lys_node *plVar2;
  bool bVar3;
  lys_module *module;
  int local_70;
  int iStack_6c;
  int8_t shorthand;
  int is_relative;
  int mod_name_len;
  int nam_len;
  int r;
  lys_node *start_parent;
  lys_node *sibling;
  char *id;
  char *mod_name;
  char *name;
  lys_node **ret_local;
  int local_28;
  int no_innerlist_local;
  int check_shorthand_local;
  int ret_nodetype_local;
  lys_node *start_local;
  char *nodeid_local;
  
  local_70 = -1;
  module._7_1_ = 0xff;
  if (check_shorthand != 0) {
    module._7_1_ = 0;
  }
  name = (char *)ret;
  ret_local._4_4_ = no_innerlist;
  local_28 = check_shorthand;
  no_innerlist_local = ret_nodetype;
  _check_shorthand_local = start;
  start_local = (lys_node *)nodeid;
  if ((nodeid == (char *)0x0) || (ret == (lys_node **)0x0)) {
    __assert_fail("nodeid && ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x6f3,
                  "int resolve_descendant_schema_nodeid(const char *, const struct lys_node *, int, int, int, const struct lys_node **)"
                 );
  }
  if ((ret_nodetype & 0x3800U) != 0) {
    __assert_fail("!(ret_nodetype & (LYS_USES | LYS_AUGMENT | LYS_GROUPING))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x6f4,
                  "int resolve_descendant_schema_nodeid(const char *, const struct lys_node *, int, int, int, const struct lys_node **)"
                 );
  }
  if (start == (lys_node *)0x0) {
    nodeid_local._4_4_ = 0;
  }
  else {
    module_00 = start->module;
    sibling = (lys_node *)nodeid;
    mod_name_len = parse_schema_nodeid(nodeid,&id,&stack0xffffffffffffff94,&mod_name,&is_relative,
                                       &local_70,(int *)0x0);
    if (mod_name_len < 1) {
      nodeid_local._4_4_ = (((int)sibling - (int)start_local) - mod_name_len) + 1;
    }
    else {
      sibling = (lys_node *)(sibling->padding + (long)mod_name_len + -0x1c);
      if (local_70 != 0) {
        _nam_len = lys_parent(_check_shorthand_local);
        while( true ) {
          bVar3 = false;
          if (_nam_len->nodetype == LYS_USES) {
            plVar2 = lys_parent(_nam_len);
            bVar3 = plVar2 != (lys_node *)0x0;
          }
          if (!bVar3) break;
          _nam_len = lys_parent(_nam_len);
        }
        do {
          start_parent = (lys_node *)0x0;
          do {
            while( true ) {
              do {
                start_parent = lys_getnext(start_parent,_nam_len,module_00,0x83);
                if (start_parent == (lys_node *)0x0) goto LAB_0011775e;
              } while (((start_parent->name == (char *)0x0) ||
                       (iVar1 = strncmp(mod_name,start_parent->name,(long)is_relative), iVar1 != 0))
                      || (start_parent->name[is_relative] != '\0'));
              mod_name_len = schema_nodeid_siblingcheck
                                       (start_parent,(int8_t *)((long)&module + 7),(char *)sibling,
                                        module_00,id,iStack_6c,0,(lys_node **)&nam_len);
              if (mod_name_len != 0) break;
              if ((start_parent->nodetype & no_innerlist_local) != LYS_UNKNOWN) {
                *(lys_node **)name = start_parent;
                return 0;
              }
            }
          } while (mod_name_len == 1);
          if (mod_name_len != 2) {
            return -1;
          }
LAB_0011775e:
          if (start_parent == (lys_node *)0x0) {
            name[0] = '\0';
            name[1] = '\0';
            name[2] = '\0';
            name[3] = '\0';
            name[4] = '\0';
            name[5] = '\0';
            name[6] = '\0';
            name[7] = '\0';
            return 0;
          }
          if ((ret_local._4_4_ != 0) && (start_parent->nodetype == LYS_LIST)) {
            name[0] = '\0';
            name[1] = '\0';
            name[2] = '\0';
            name[3] = '\0';
            name[4] = '\0';
            name[5] = '\0';
            name[6] = '\0';
            name[7] = '\0';
            return -2;
          }
          mod_name_len = parse_schema_nodeid((char *)sibling,&id,&stack0xffffffffffffff94,&mod_name,
                                             &is_relative,&local_70,(int *)0x0);
          if (mod_name_len < 1) {
            return (((int)sibling - (int)start_local) - mod_name_len) + 1;
          }
          sibling = (lys_node *)(sibling->padding + (long)mod_name_len + -0x1c);
        } while( true );
      }
      nodeid_local._4_4_ = -1;
    }
  }
  return nodeid_local._4_4_;
}

Assistant:

int
resolve_descendant_schema_nodeid(const char *nodeid, const struct lys_node *start, int ret_nodetype,
                                 int check_shorthand, int no_innerlist, const struct lys_node **ret)
{
    const char *name, *mod_name, *id;
    const struct lys_node *sibling, *start_parent;
    int r, nam_len, mod_name_len, is_relative = -1;
    int8_t shorthand = check_shorthand ? 0 : -1;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *module;

    assert(nodeid && ret);
    assert(!(ret_nodetype & (LYS_USES | LYS_AUGMENT | LYS_GROUPING)));

    if (!start) {
        /* leaf not found */
        return 0;
    }

    id = nodeid;
    module = start->module;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL)) < 1) {
        return ((id - nodeid) - r) + 1;
    }
    id += r;

    if (!is_relative) {
        return -1;
    }

    start_parent = lys_parent(start);
    while ((start_parent->nodetype == LYS_USES) && lys_parent(start_parent)) {
        start_parent = lys_parent(start_parent);
    }

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module,
                                      LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_PARENTUSES))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                r = schema_nodeid_siblingcheck(sibling, &shorthand, id, module, mod_name, mod_name_len, 0, &start_parent);
                if (r == 0) {
                    if (!(sibling->nodetype & ret_nodetype)) {
                        /* wrong node type, too bad */
                        continue;
                    }
                    *ret = sibling;
                    return EXIT_SUCCESS;
                } else if (r == 1) {
                    continue;
                } else if (r == 2) {
                    break;
                } else {
                    return -1;
                }
            }
        }

        /* no match */
        if (!sibling) {
            *ret = NULL;
            return EXIT_SUCCESS;
        } else if (no_innerlist && sibling->nodetype == LYS_LIST) {
            *ret = NULL;
            return -2;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL)) < 1) {
            return ((id - nodeid) - r) + 1;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT;
    return -1;
}